

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O3

Node verona::append_fq(Node *fq,Node *node)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  undefined8 uVar7;
  element_type *this;
  undefined8 uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Token *pTVar10;
  int iVar11;
  undefined1 *puVar12;
  long *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  void *__child_stack_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  NodeDef *pNVar14;
  void *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Node NVar15;
  Node local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  WFLookup local_1a8;
  undefined1 *local_188;
  Token local_180;
  WFLookup local_178;
  undefined1 local_158 [24];
  element_type *peStack_140;
  undefined1 local_138 [40];
  NodeDef *pNStack_110;
  undefined1 local_108 [24];
  NodeDef *pNStack_f0;
  undefined1 local_e8 [16];
  WFLookup local_d8;
  undefined1 local_b8 [24];
  NodeDef *pNStack_a0;
  WFLookup local_98;
  WFLookup local_78;
  Token local_58;
  Token local_50;
  Token local_48;
  Token local_40;
  Token local_38;
  
  p_Var4 = &local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_1a8.wf = (Wellformed *)FQType;
  local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)FQFunction;
  pTVar10 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (&local_1a8,p_Var4,
                       &((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->type_);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pTVar10 == p_Var4) {
    __assert_fail("fq->type().in({FQType, FQFunction})",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a0,"Node verona::append_fq(Node, Node)");
  }
  local_1a8.wf = (Wellformed *)TypeClassName;
  local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&TypeAliasName;
  local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeParamName;
  local_1a8.index = (size_t)TypeTraitName;
  local_188 = Selector;
  pTVar10 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (&local_1a8,&local_180,*in_RDX + 0x10);
  if (pTVar10 == &local_180) {
    __assert_fail("node->in( {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a2,"Node verona::append_fq(Node, Node)");
  }
  if ((((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_).def
      != (TokenDef *)FQFunction) {
    iVar11 = 0x2d7288;
    if (*(undefined1 **)(*in_RDX + 0x10) == Selector) {
      local_1a8.wf = (Wellformed *)FQFunction;
      NVar15 = trieste::NodeDef::create((NodeDef *)local_138,(Token *)&local_1a8);
      peVar6 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var5 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      if (peVar6 == (element_type *)0x0) {
        local_e8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8._8_8_ = (element_type *)0x0;
      }
      else {
        trieste::NodeDef::clone
                  ((NodeDef *)local_e8,(__fn *)peVar6,
                   NVar15.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi,iVar11,in_R8);
        if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
                 *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi
                 + 1;
            UNLOCK();
          }
          else {
            *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
                 *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi
                 + 1;
          }
        }
      }
      local_1a8.wf = (Wellformed *)local_e8._0_8_;
      local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8._8_8_;
      trieste::NodeDef::push_back((NodeDef *)local_138._0_8_,(Node *)&local_1a8);
      if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      uVar8 = local_138._8_8_;
      uVar7 = local_138._0_8_;
      local_138._0_8_ = (NodeDef *)0x0;
      local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8.wf = (Wellformed *)*in_RDX;
      peVar6 = (element_type *)in_RDX[1];
      if (peVar6 == (element_type *)0x0) {
        local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar6;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                      super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
            UNLOCK();
            goto LAB_00157917;
          }
        }
        else {
          p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
        p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
      }
LAB_00157917:
      trieste::NodeDef::push_back((NodeDef *)uVar7,(Node *)&local_1a8);
      _Var13._M_pi = extraout_RDX_24;
      if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        _Var13._M_pi = extraout_RDX_25;
      }
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar7;
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      if (peVar6 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
        _Var13._M_pi = extraout_RDX_26;
      }
      if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        _Var13._M_pi = extraout_RDX_27;
      }
      pNVar14 = (NodeDef *)local_138._8_8_;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        _Var13._M_pi = extraout_RDX_28;
        pNVar14 = (NodeDef *)local_138._8_8_;
      }
      goto LAB_0015796e;
    }
    local_1a8.wf = (Wellformed *)FQType;
    trieste::NodeDef::create((NodeDef *)(local_138 + 0x20),(Token *)&local_1a8);
    local_78.wf = (Wellformed *)TypePath;
    trieste::operator/(&local_1a8,node,(Token *)&local_78);
    if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1b0 = local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_158._0_8_ = (NodeDef *)0x0;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      trieste::NodeDef::clone
                ((NodeDef *)local_158,
                 (__fn *)local_1a8.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack,iVar11,in_R8);
    }
    local_d8.wf = (Wellformed *)Type;
    trieste::operator/(&local_98,node,(Token *)(local_e8 + 0x10));
    _Var9._M_pi = local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pNStack_f0 = (NodeDef *)0x0;
    }
    else {
      trieste::NodeDef::clone
                ((NodeDef *)(local_108 + 0x10),
                 (__fn *)local_98.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack_01,iVar11,in_R8);
      if (pNStack_f0 != (NodeDef *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &((string *)&pNStack_f0->super_enable_shared_from_this<trieste::NodeDef>)->
                    _M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &((string *)&pNStack_f0->super_enable_shared_from_this<trieste::NodeDef>)->
                    _M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
    }
    local_178.wf = (Wellformed *)local_108._16_8_;
    local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pNStack_f0;
    trieste::NodeDef::push_back((NodeDef *)local_158._0_8_,(Node *)&local_178);
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    uVar7 = local_158._8_8_;
    local_178.wf = (Wellformed *)local_158._0_8_;
    local_158._0_8_ = (NodeDef *)0x0;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
      }
    }
    trieste::NodeDef::push_back((NodeDef *)local_138._32_8_,(Node *)&local_178);
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    pNVar14 = pNStack_110;
    uVar8 = local_138._32_8_;
    local_138._32_8_ = (NodeDef *)0x0;
    pNStack_110 = (NodeDef *)0x0;
    local_178.wf = (Wellformed *)*in_RDX;
    peVar6 = (element_type *)in_RDX[1];
    if (peVar6 == (element_type *)0x0) {
      local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar6;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
          goto LAB_001574b9;
        }
      }
      else {
        p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
      }
      p_Var3 = &(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
    }
LAB_001574b9:
    trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_178);
    _Var13._M_pi = extraout_RDX;
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      _Var13._M_pi = extraout_RDX_00;
    }
    (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)uVar8;
    (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar14;
    if (peVar6 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
      _Var13._M_pi = extraout_RDX_01;
    }
    p_Var5 = local_1b0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      _Var13._M_pi = extraout_RDX_02;
    }
    if (pNStack_f0 != (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNStack_f0);
      _Var13._M_pi = extraout_RDX_03;
    }
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      _Var13._M_pi = extraout_RDX_04;
    }
    if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var13._M_pi = extraout_RDX_05;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      _Var13._M_pi = extraout_RDX_06;
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      _Var13._M_pi = extraout_RDX_07;
    }
    pNVar14 = pNStack_110;
    if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var13._M_pi = extraout_RDX_08;
      pNVar14 = pNStack_110;
    }
    goto LAB_0015796e;
  }
  puVar12 = Selector;
  if (*(undefined1 **)(*in_RDX + 0x10) == Selector) {
    __assert_fail("node != Selector",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a7,"Node verona::append_fq(Node, Node)");
  }
  local_1a8.wf = (Wellformed *)FQType;
  trieste::NodeDef::create((NodeDef *)local_108,(Token *)&local_1a8);
  local_38.def = (TokenDef *)FQType;
  trieste::operator/(&local_98,node,&local_38);
  local_40.def = (TokenDef *)TypePath;
  trieste::wf::detail::WFLookup::operator/(&local_1a8,&local_98,&local_40);
  if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_138._24_8_ =
       local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_158._16_8_ = (NodeDef *)0x0;
    peStack_140 = (element_type *)0x0;
  }
  else {
    trieste::NodeDef::clone
              ((NodeDef *)(local_158 + 0x10),
               (__fn *)local_1a8.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               __child_stack_00,(int)puVar12,in_R8);
  }
  local_48.def = (TokenDef *)FQType;
  trieste::operator/(&local_78,node,&local_48);
  local_50.def = (TokenDef *)Type;
  trieste::wf::detail::WFLookup::operator/(&local_178,&local_78,&local_50);
  local_1b0 = local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pNStack_a0 = (NodeDef *)0x0;
  }
  else {
    trieste::NodeDef::clone
              ((NodeDef *)(local_b8 + 0x10),
               (__fn *)local_178.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               __child_stack_02,(int)puVar12,in_R8);
    puVar12 = (undefined1 *)local_b8._16_8_;
    if (pNStack_a0 != (NodeDef *)0x0) {
      puVar12 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                     *)&pNStack_a0->super_enable_shared_from_this<trieste::NodeDef>)->_M_t)._M_impl.
                  super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
      }
      else {
        p_Var2 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                     *)&pNStack_a0->super_enable_shared_from_this<trieste::NodeDef>)->_M_t)._M_impl.
                  super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
      }
    }
  }
  iVar11 = (int)puVar12;
  local_d8.wf = (Wellformed *)local_b8._16_8_;
  local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pNStack_a0
  ;
  trieste::NodeDef::push_back((NodeDef *)local_158._16_8_,(Node *)(local_e8 + 0x10));
  if (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (NodeDef *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  this = peStack_140;
  uVar7 = local_158._16_8_;
  local_158._16_8_ = (NodeDef *)0x0;
  peStack_140 = (element_type *)0x0;
  local_58.def = (TokenDef *)Selector;
  trieste::operator/((WFLookup *)(local_e8 + 0x10),node,&local_58);
  _Var9._M_pi = local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (NodeDef *)0x0) {
    local_b8._0_8_ = (element_type *)0x0;
    local_b8._8_8_ = (element_type *)0x0;
  }
  else {
    trieste::NodeDef::clone
              ((NodeDef *)local_b8,
               (__fn *)local_d8.node.
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               __child_stack_03,iVar11,in_R8);
    if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (((_Rb_tree_header *)(local_b8._8_8_ + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)(local_b8._8_8_ + 8))->_M_header)._M_color + _S_black;
        UNLOCK();
      }
      else {
        (((_Rb_tree_header *)(local_b8._8_8_ + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)(local_b8._8_8_ + 8))->_M_header)._M_color + _S_black;
      }
    }
  }
  local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8._0_8_;
  local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
  trieste::NodeDef::push_back((NodeDef *)uVar7,&local_1c8);
  if (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (this != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(this->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(this->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  trieste::NodeDef::push_back((NodeDef *)local_108._0_8_,&local_1c8);
  if (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar8 = local_108._8_8_;
  uVar7 = local_108._0_8_;
  local_108._0_8_ = (NodeDef *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var5;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
        goto LAB_00157785;
      }
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
  }
LAB_00157785:
  trieste::NodeDef::push_back((NodeDef *)uVar7,&local_1c8);
  _Var13._M_pi = extraout_RDX_09;
  if (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_10;
  }
  (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)uVar7;
  (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    _Var13._M_pi = extraout_RDX_11;
  }
  uVar7 = local_138._24_8_;
  if (this != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    _Var13._M_pi = extraout_RDX_12;
  }
  p_Var5 = local_1b0;
  if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    _Var13._M_pi = extraout_RDX_13;
  }
  if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    _Var13._M_pi = extraout_RDX_14;
  }
  if (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_15;
  }
  if (pNStack_a0 != (NodeDef *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNStack_a0);
    _Var13._M_pi = extraout_RDX_16;
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    _Var13._M_pi = extraout_RDX_17;
  }
  if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_18;
  }
  if (local_78.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_19;
  }
  if (peStack_140 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_140);
    _Var13._M_pi = extraout_RDX_20;
  }
  if ((element_type *)uVar7 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
    _Var13._M_pi = extraout_RDX_21;
  }
  if (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_22;
  }
  pNVar14 = (NodeDef *)local_108._8_8_;
  if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_23;
    pNVar14 = (NodeDef *)local_108._8_8_;
  }
LAB_0015796e:
  if (pNVar14 != (NodeDef *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar14);
    _Var13._M_pi = extraout_RDX_29;
  }
  NVar15.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  NVar15.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fq;
  return (Node)NVar15.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node append_fq(Node fq, Node node)
  {
    assert(fq->type().in({FQType, FQFunction}));
    assert(node->in(
      {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector}));

    if (fq == FQFunction)
    {
      // FQFunction + Selector = not allowed
      assert(node != Selector);

      // FQFunction + Type = FQType
      return FQType << (clone(fq / FQType / TypePath)
                        << clone(fq / FQType / Type) << clone(fq / Selector))
                    << node;
    }

    // FQType + Selector = FQFunction
    if (node == Selector)
      return FQFunction << clone(fq) << node;

    // FQType + Type = FQType
    return FQType << (clone(fq / TypePath) << clone(fq / Type)) << node;
  }